

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall MainWindow::OpenImagePreviewWindow(MainWindow *this,QImage *toPreview)

{
  QScrollArea *pQVar1;
  QLabel *this_00;
  QFlags<Qt::ImageConversionFlag> local_5c;
  QPixmap local_58 [28];
  QFlags<Qt::WindowType> local_3c;
  QLabel *local_38;
  QLabel *previewImage;
  QScrollArea *local_20;
  QScrollArea *previewArea;
  QImage *toPreview_local;
  MainWindow *this_local;
  
  previewArea = (QScrollArea *)toPreview;
  toPreview_local = (QImage *)this;
  pQVar1 = (QScrollArea *)operator_new(0x28);
  QScrollArea::QScrollArea(pQVar1,(QWidget *)0x0);
  local_20 = pQVar1;
  this_00 = (QLabel *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags(&local_3c);
  QLabel::QLabel(this_00,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_3c.i);
  pQVar1 = previewArea;
  local_38 = this_00;
  QFlags<Qt::ImageConversionFlag>::QFlags(&local_5c,AutoColor);
  QPixmap::fromImage((QImage *)local_58,(QFlags_conflict1 *)pQVar1);
  QLabel::setPixmap((QPixmap *)this_00);
  QPixmap::~QPixmap(local_58);
  QScrollArea::setWidget((QWidget *)local_20);
  QWidget::showMaximized();
  return;
}

Assistant:

void MainWindow::OpenImagePreviewWindow(const QImage& toPreview)
{
    QScrollArea* previewArea = new QScrollArea(nullptr);
    QLabel* previewImage = new QLabel();
    previewImage->setPixmap(QPixmap::fromImage(toPreview));
    previewArea->setWidget(previewImage);
    previewArea->showMaximized();
}